

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

double calc_mean_only<double,unsigned_long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr)

{
  ulong *puVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *puVar9;
  unsigned_long uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  
  uVar10 = Xc_indptr[col_num];
  uVar2 = Xc_indptr[col_num + 1];
  dVar13 = 0.0;
  if (uVar10 != uVar2) {
    puVar6 = ix_arr + st;
    puVar7 = ix_arr + end + 1;
    uVar3 = (long)puVar7 - (long)puVar6 >> 3;
    if (0 < (long)uVar3) {
      do {
        uVar11 = uVar3 >> 1;
        uVar12 = ~uVar11 + uVar3;
        uVar3 = uVar11;
        if (puVar6[uVar11] < Xc_ind[uVar10]) {
          puVar6 = puVar6 + uVar11 + 1;
          uVar3 = uVar12;
        }
      } while (0 < (long)uVar3);
    }
    uVar3 = (end - st) + 1;
    if (uVar10 == uVar2 || puVar6 == puVar7) {
      uVar11 = 0;
      dVar14 = 0.0;
    }
    else {
      dVar14 = 0.0;
      uVar11 = 0;
      while (uVar12 = *puVar6, uVar12 <= Xc_ind[uVar2 - 1]) {
        puVar1 = Xc_ind + uVar10;
        uVar4 = *puVar1;
        if (uVar4 == uVar12) {
          if ((ulong)ABS(Xc[uVar10]) < 0x7ff0000000000000) {
            uVar11 = uVar11 + 1;
            auVar15._8_4_ = (int)(uVar11 >> 0x20);
            auVar15._0_8_ = uVar11;
            auVar15._12_4_ = 0x45300000;
            dVar14 = dVar14 + (Xc[uVar10] - dVar14) /
                              ((auVar15._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0));
          }
          else {
            uVar3 = uVar3 - 1;
          }
          if ((puVar6 == ix_arr + end) || (uVar10 == uVar2 - 1)) break;
          puVar9 = puVar1 + 1;
          puVar6 = puVar6 + 1;
          uVar12 = (long)((long)Xc_ind + (uVar2 * 8 - (long)puVar9)) >> 3;
          if (0 < (long)uVar12) {
            do {
              uVar8 = uVar12 >> 1;
              uVar4 = ~uVar8 + uVar12;
              uVar12 = uVar8;
              if ((puVar9 + uVar8 + 1)[-1] < *puVar6) {
                puVar9 = puVar9 + uVar8 + 1;
                uVar12 = uVar4;
              }
            } while (0 < (long)uVar12);
          }
LAB_002418be:
          uVar10 = (long)puVar9 - (long)Xc_ind >> 3;
        }
        else {
          if (uVar4 <= uVar12) {
            puVar9 = puVar1 + 1;
            uVar4 = (long)((long)Xc_ind + (uVar2 * 8 - (long)(puVar1 + 1))) >> 3;
            while (0 < (long)uVar4) {
              uVar8 = uVar4 >> 1;
              uVar5 = ~uVar8 + uVar4;
              uVar4 = uVar8;
              if ((puVar9 + uVar8 + 1)[-1] < uVar12) {
                puVar9 = puVar9 + uVar8 + 1;
                uVar4 = uVar5;
              }
            }
            goto LAB_002418be;
          }
          puVar6 = puVar6 + 1;
          uVar12 = (long)puVar7 - (long)puVar6 >> 3;
          while (0 < (long)uVar12) {
            uVar8 = uVar12 >> 1;
            uVar5 = ~uVar8 + uVar12;
            uVar12 = uVar8;
            if (puVar6[uVar8] < uVar4) {
              puVar6 = puVar6 + uVar8 + 1;
              uVar12 = uVar5;
            }
          }
        }
        if ((puVar6 == puVar7) || (uVar10 == uVar2)) break;
      }
    }
    dVar13 = 0.0;
    if ((uVar11 != 0) && (dVar13 = dVar14, uVar11 < uVar3)) {
      dVar13 = (double)((((float)(long)uVar11 + (float)(&DAT_0036b0d8)[(long)uVar11 < 0]) /
                        ((float)(long)uVar3 + (float)(&DAT_0036b0d8)[(long)uVar3 < 0])) *
                       (float)dVar14);
    }
  }
  return dVar13;
}

Assistant:

double calc_mean_only(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return 0;
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    double m = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
                cnt--;
            else
                m += (Xc[curr_pos] - m) / (double)(++added);

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
        return 0;

    if (cnt > added)
        m *= ((ldouble_safe)added / (ldouble_safe)cnt);

    return m;
}